

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

void adjust_assign(LexState *ls,int nvars,int nexps,expdesc *e)

{
  FuncState *fs_00;
  int n;
  int local_30;
  int extra;
  int needed;
  FuncState *fs;
  expdesc *e_local;
  int nexps_local;
  int nvars_local;
  LexState *ls_local;
  
  fs_00 = ls->fs;
  n = nvars - nexps;
  if ((e->k == VCALL) || (e->k == VVARARG)) {
    local_30 = n + 1;
    if (local_30 < 0) {
      local_30 = 0;
    }
    luaK_setreturns(fs_00,e,local_30);
  }
  else {
    if (e->k != VVOID) {
      luaK_exp2nextreg(fs_00,e);
    }
    if (0 < n) {
      luaK_nil(fs_00,(uint)fs_00->freereg,n);
    }
  }
  if (n < 1) {
    fs_00->freereg = fs_00->freereg + (char)n;
  }
  else {
    luaK_reserveregs(fs_00,n);
  }
  return;
}

Assistant:

static void adjust_assign (LexState *ls, int nvars, int nexps, expdesc *e) {
  FuncState *fs = ls->fs;
  int needed = nvars - nexps;  /* extra values needed */
  if (hasmultret(e->k)) {  /* last expression has multiple returns? */
    int extra = needed + 1;  /* discount last expression itself */
    if (extra < 0)
      extra = 0;
    luaK_setreturns(fs, e, extra);  /* last exp. provides the difference */
  }
  else {
    if (e->k != VVOID)  /* at least one expression? */
      luaK_exp2nextreg(fs, e);  /* close last expression */
    if (needed > 0)  /* missing values? */
      luaK_nil(fs, fs->freereg, needed);  /* complete with nils */
  }
  if (needed > 0)
    luaK_reserveregs(fs, needed);  /* registers for extra values */
  else  /* adding 'needed' is actually a subtraction */
    fs->freereg = cast_byte(fs->freereg + needed);  /* remove extra values */
}